

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O2

AssertionResult * __thiscall
iutest::AssertionResult::operator!(AssertionResult *__return_storage_ptr__,AssertionResult *this)

{
  AssertionResult *rhs;
  pointer local_38;
  AssertionResult local_30;
  
  local_30.m_result = (bool)(this->m_result ^ 1);
  local_30.m_message._M_dataplus._M_p = (pointer)&local_30.m_message.field_2;
  local_30.m_message._M_string_length = 0;
  local_30.m_message.field_2._M_local_buf[0] = '\0';
  local_38 = (this->m_message)._M_dataplus._M_p;
  rhs = operator<<(&local_30,&local_38);
  AssertionResult(__return_storage_ptr__,rhs);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

AssertionResult operator ! () const
    {
        return AssertionResult(failed()) << message();
    }